

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O3

void ur_kpss(double *y,int N,char *type,int lshort,int *klag,double *statistic,double *pval)

{
  size_t __size;
  int *piVar1;
  double *y_00;
  int iVar2;
  double *pdVar3;
  double *res;
  double *csum;
  double *varcovar;
  int l;
  ulong uVar4;
  undefined4 in_register_00000034;
  double *pdVar5;
  double dVar6;
  bool bVar7;
  double dVar8;
  double dStack_a8;
  double tablep [4];
  double ylo;
  double yhi;
  double *local_70;
  double *local_68;
  reg_object local_60;
  int local_54;
  int *local_50;
  double *local_48;
  double local_40;
  double *local_38;
  
  local_40 = (double)CONCAT44(in_register_00000034,N);
  tablep[1] = 0.05;
  tablep[2] = 0.1;
  dStack_a8 = 0.01;
  tablep[0] = 0.025;
  __size = (long)N * 8;
  local_70 = statistic;
  local_54 = lshort;
  local_50 = klag;
  local_38 = y;
  pdVar3 = (double *)malloc(__size);
  res = (double *)malloc(__size);
  local_48 = (double *)malloc(0x20);
  csum = (double *)malloc(__size);
  if (0 < N) {
    uVar4 = 1;
    do {
      pdVar3[uVar4 - 1] = (double)(int)uVar4;
      uVar4 = uVar4 + 1;
    } while (SUB84(local_40,0) + 1 != uVar4);
  }
  iVar2 = strcmp(type,"trend");
  if (iVar2 == 0) {
    *local_48 = 0.216;
    local_48[1] = 0.176;
    local_48[2] = 0.146;
    local_48[3] = 0.119;
    varcovar = (double *)malloc(0x20);
    dVar6 = local_40;
    local_60 = reg_init(SUB84(local_40,0),2);
    pdVar5 = pdVar3;
  }
  else {
    iVar2 = strcmp(type,"level");
    if (iVar2 != 0) {
      puts("kpss only accepts two types - level and trend. ");
      exit(-1);
    }
    *local_48 = 0.739;
    local_48[1] = 0.574;
    local_48[2] = 0.463;
    local_48[3] = 0.347;
    varcovar = (double *)malloc(8);
    dVar6 = local_40;
    local_60 = reg_init(SUB84(local_40,0),1);
    pdVar5 = (double *)0x0;
  }
  y_00 = local_38;
  local_38 = varcovar;
  regress(local_60,pdVar5,y_00,res,varcovar,0.95);
  iVar2 = SUB84(dVar6,0);
  cumsum(res,iVar2,csum);
  if (iVar2 < 1) {
    dVar8 = 0.0;
    local_40 = 0.0;
  }
  else {
    local_40 = 0.0;
    uVar4 = 0;
    dVar8 = 0.0;
    do {
      local_40 = local_40 + csum[uVar4] * csum[uVar4];
      dVar8 = dVar8 + res[uVar4] * res[uVar4];
      uVar4 = uVar4 + 1;
    } while (((ulong)dVar6 & 0xffffffff) != uVar4);
  }
  local_40 = local_40 / (double)(iVar2 * iVar2);
  yhi = dVar8 / (double)iVar2;
  bVar7 = local_54 == 1;
  dVar6 = pow((double)iVar2 / 100.0,0.25);
  piVar1 = local_50;
  l = (int)(dVar6 * *(double *)(&DAT_00155c78 + (ulong)bVar7 * 8));
  if ((local_50 != (int *)0x0) && (0 < *local_50)) {
    l = *local_50;
  }
  local_50 = (int *)CONCAT44(local_50._4_4_,l);
  local_68 = pdVar3;
  ppsum(res,iVar2,l,&yhi);
  pdVar5 = local_48;
  pdVar3 = local_70;
  *local_70 = local_40 / yhi;
  arrayminmax(local_48,4,tablep + 3,&ylo);
  dVar6 = interpolate_linear(pdVar5,&dStack_a8,4,*pdVar3);
  *pval = dVar6;
  if (piVar1 != (int *)0x0) {
    *piVar1 = (int)local_50;
  }
  free(local_48);
  free(local_68);
  free(res);
  free(csum);
  free(local_38);
  free_reg(local_60);
  return;
}

Assistant:

void ur_kpss(double *y, int N,const char* type,int lshort, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    type - "level" or "trend"
    lshort - determines the length of lag used. lshort = 1 => lag = 4.0 * pow(((double) N)/100.0,0.25)
    else lag = 12.0 * pow(((double) N)/100.0,0.25). It can be bypassed by parameter klag
    klag - Length of the lag. Set it to > 0 instead of NULL if you wnat it to bypass lshort. Set it to NULL or negative otherwise

    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int i,p,l;
    double *tt,*res,*table,*varcovar,*csum;
    double alpha,eta,s2,ylo,yhi;
    reg_object fit;

    double tablep[4] = {0.01, 0.025, 0.05, 0.10};

    tt = (double*)malloc(sizeof(double)*N);
    res = (double*)malloc(sizeof(double)*N);
    table = (double*)malloc(sizeof(double)*4);
    csum = (double*)malloc(sizeof(double)*N);

    for(i = 1; i <= N;++i) {
        tt[i-1] = (double) i;
    }

    alpha = 0.95;

    if (!strcmp(type,"trend")) {
            table[0] = 0.216; table[1] = 0.176; table[2] = 0.146; table[3] = 0.119;
            p = 2;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,tt,y,res,varcovar,alpha);

        } else if (!strcmp(type,"level")) {
            table[0] = 0.739; table[1] = 0.574; table[2] = 0.463; table[3] = 0.347;
            p = 1;
            varcovar = (double*)malloc(sizeof(double)*p*p);

            fit = reg_init(N,p);
            regress(fit,NULL,y,res,varcovar,alpha);
    } else {
        printf("kpss only accepts two types - level and trend. \n");
        exit(-1);
    }

    cumsum(res,N,csum);

    eta = s2 = 0.0;

    for(i = 0; i < N;++i) {
        eta += (csum[i] * csum[i]);
        s2 += (res[i] * res[i]);
    }

    eta /= (double) (N*N);
    s2 /= (double) N;

    if (lshort == 1) {
        l = (int) 4.0 * pow(((double) N)/100.0,0.25);
    } else {
        l = (int) 12.0 * pow(((double) N)/100.0,0.25);
    }

    if (klag != NULL && *klag > 0) {
        l = *klag;
    }

    ppsum(res,N,l,&s2);

    *statistic = eta/s2;

    arrayminmax(table,4,&ylo,&yhi);

    *pval = interpolate_linear(table,tablep,4,*statistic);

    if (klag != NULL) *klag = l;

    free(table);
    free(tt);
    free(res);
    free(csum);
    free(varcovar);
    free_reg(fit);
}